

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ext_ocsp_parse_clienthello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  int iVar1;
  uint8_t status_type;
  uint8_t local_9;
  
  if (contents != (CBS *)0x0) {
    iVar1 = CBS_get_u8(contents,&local_9);
    if (iVar1 != 0) {
      *(uint *)&hs->field_0x6c8 =
           *(uint *)&hs->field_0x6c8 & 0xffffff7f | (uint)(local_9 == '\x01') << 7;
    }
    return iVar1 != 0;
  }
  return true;
}

Assistant:

static bool ext_ocsp_parse_clienthello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                       CBS *contents) {
  if (contents == NULL) {
    return true;
  }

  uint8_t status_type;
  if (!CBS_get_u8(contents, &status_type)) {
    return false;
  }

  // We cannot decide whether OCSP stapling will occur yet because the correct
  // SSL_CTX might not have been selected.
  hs->ocsp_stapling_requested = status_type == TLSEXT_STATUSTYPE_ocsp;

  return true;
}